

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testOptimizedInterleavePatterns.cpp
# Opt level: O2

ChannelList *
anon_unknown.dwarf_2273d4::setupBuffer
          (ChannelList *__return_storage_ptr__,Header *hdr,char **channels,char **passivechannels,
          PixelType *pt,FrameBuffer *buf,FrameBuffer *prereadbuf,FrameBuffer *postreadbuf,int banks,
          bool writing)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  int iVar3;
  Channel *pCVar4;
  Slice *pSVar5;
  bool bVar6;
  int iVar7;
  int *piVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  long *plVar13;
  char **ppcVar14;
  uint uVar15;
  int iVar16;
  PixelType PVar17;
  vector<char,_std::allocator<char>_> *this;
  pointer pcVar18;
  pointer pcVar19;
  char *pcVar20;
  int iVar21;
  int iVar22;
  ulong uVar23;
  int iVar24;
  ulong uVar25;
  ulong uVar26;
  bool bVar27;
  ulong local_c8;
  Channel local_68 [56];
  
  piVar8 = (int *)Imf_3_2::Header::dataWindow();
  iVar2 = *piVar8;
  iVar3 = piVar8[1];
  iVar22 = piVar8[2];
  bVar27 = false;
  iVar7 = 0;
  for (uVar26 = 0; ppcVar14 = passivechannels, iVar21 = iVar7, local_c8 = uVar26, bVar6 = bVar27,
      channels[uVar26] != (char *)0x0; uVar26 = uVar26 + 1) {
    if (pt == (PixelType *)0x0) {
LAB_0017df8d:
      iVar7 = iVar7 + 2;
    }
    else {
      PVar17 = pt[uVar26];
      if ((PVar17 != UINT) && (PVar17 != FLOAT)) {
        if (PVar17 == HALF) goto LAB_0017df8d;
        goto LAB_0017e3dc;
      }
      iVar7 = iVar7 + (-iVar7 & 3U) + 4;
      bVar27 = true;
    }
  }
LAB_0017dfc9:
  iVar16 = iVar7;
  bVar12 = bVar27;
  if ((passivechannels == (char **)0x0) ||
     (iVar16 = iVar21, bVar12 = bVar6, *ppcVar14 == (char *)0x0)) goto LAB_0017e018;
  if (pt == (PixelType *)0x0) {
LAB_0017dff6:
    iVar21 = iVar21 + 2;
  }
  else {
    PVar17 = pt[local_c8];
    if ((PVar17 != UINT) && (PVar17 != FLOAT)) {
      if (PVar17 == HALF) goto LAB_0017dff6;
LAB_0017e3dc:
      std::operator<<((ostream *)&std::cout,"Unexpected PixelType?\n");
LAB_0017e3ef:
      exit(1);
    }
    iVar21 = iVar21 + (-iVar21 & 3U) + 4;
    bVar6 = true;
  }
  ppcVar14 = ppcVar14 + 1;
  local_c8 = local_c8 + 1;
  goto LAB_0017dfc9;
LAB_0017e018:
  uVar15 = -iVar16 & 3;
  if (!bVar12) {
    uVar15 = 0;
  }
  iVar16 = uVar15 + iVar16;
  lVar9 = Imf_3_2::Header::dataWindow();
  iVar7 = *(int *)(lVar9 + 8);
  piVar8 = (int *)Imf_3_2::Header::dataWindow();
  iVar21 = (iVar7 - *piVar8) + 1;
  lVar9 = Imf_3_2::Header::dataWindow();
  iVar7 = *(int *)(lVar9 + 0xc);
  lVar9 = Imf_3_2::Header::dataWindow();
  iVar24 = (iVar7 - *(int *)(lVar9 + 4)) + 1;
  iVar7 = (int)local_c8;
  this = (vector<char,_std::allocator<char>_> *)&(anonymous_namespace)::readingBuffer;
  if (writing) {
    this = (vector<char,_std::allocator<char>_> *)&(anonymous_namespace)::writingBuffer;
  }
  std::vector<char,_std::allocator<char>_>::resize(this,(long)(iVar24 * iVar16 * iVar21 * iVar7));
  pcVar18 = (this->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
            _M_start;
  iVar21 = iVar24 * iVar21 * iVar7;
  if (iVar21 < 1) {
    iVar21 = 0;
  }
  iVar24 = 0;
  while (bVar27 = iVar21 != 0, iVar21 = iVar21 + -1, bVar27) {
    uVar15 = random_int(0xffff);
    if ((pt == (PixelType *)0x0) || (pt[iVar24] == HALF)) {
      *(short *)pcVar18 = (short)uVar15;
      pcVar18 = pcVar18 + 2;
    }
    else {
      pcVar19 = pcVar18 + (-(int)pcVar18 & 3);
      pcVar18 = pcVar19 + 4;
      *(undefined4 *)pcVar19 =
           *(undefined4 *)(_imath_half_to_float_table + (ulong)(uVar15 & 0xffff) * 4);
    }
    iVar24 = iVar24 + 1;
    if (iVar24 == iVar7) {
      iVar24 = 0;
    }
  }
  if (!writing) {
    std::vector<char,_std::allocator<char>_>::operator=
              ((vector<char,_std::allocator<char>_> *)(anonymous_namespace)::preReadBuffer,
               (vector<char,_std::allocator<char>_> *)&(anonymous_namespace)::readingBuffer);
  }
  p_Var1 = &(__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  iVar22 = iVar16 * ((iVar22 - iVar2) + 1);
  uVar10 = (ulong)(iVar16 / banks);
  uVar11 = (ulong)iVar22;
  uVar25 = 0;
  pcVar20 = (char *)0x0;
  do {
    if ((local_c8 & 0xffffffff) == uVar25) {
      return __return_storage_ptr__;
    }
    PVar17 = HALF;
    if (pt != (PixelType *)0x0) {
      PVar17 = pt[uVar25];
    }
    if (uVar25 < uVar26 && writing) {
      pCVar4 = (Channel *)channels[uVar25];
      Imf_3_2::Channel::Channel(local_68,PVar17,1,1,false);
      Imf_3_2::ChannelList::insert((char *)__return_storage_ptr__,pCVar4);
    }
    lVar9 = (long)(int)((long)((ulong)(uint)(iVar7 >> 0x1f) << 0x20 | local_c8 & 0xffffffff) /
                       (long)banks);
    uVar23 = (ulong)(uint)((int)uVar25 >> 0x1f) << 0x20 | uVar25 & 0xffffffff;
    if ((int)((long)uVar23 % lVar9) == 0) {
      plVar13 = &(anonymous_namespace)::readingBuffer;
      if (writing) {
        plVar13 = &(anonymous_namespace)::writingBuffer;
      }
      pcVar20 = (char *)(((long)((int)((long)uVar23 / lVar9) * (iVar22 / banks)) + *plVar13) -
                        (long)(iVar2 * (iVar16 / banks) + iVar3 * iVar22));
    }
    uVar23 = (ulong)(-(int)pcVar20 & 3);
    if ((PVar17 & ~FLOAT) != UINT) {
      uVar23 = 0;
    }
    pcVar20 = pcVar20 + uVar23;
    if (uVar25 < uVar26) {
      pSVar5 = (Slice *)channels[uVar25];
      Imf_3_2::Slice::Slice
                ((Slice *)local_68,PVar17,pcVar20,uVar10,uVar11,1,1,(double)((int)uVar25 + 100),
                 false,false);
      Imf_3_2::FrameBuffer::insert((char *)buf,pSVar5);
    }
    else if (!writing) {
      pSVar5 = (Slice *)passivechannels[uVar25 - (long)(int)uVar26];
      Imf_3_2::Slice::Slice((Slice *)local_68,PVar17,pcVar20,uVar10,uVar11,1,1,0.4,false,false);
      Imf_3_2::FrameBuffer::insert((char *)postreadbuf,pSVar5);
      pSVar5 = (Slice *)passivechannels[uVar25 - (long)(int)uVar26];
      Imf_3_2::Slice::Slice
                ((Slice *)local_68,PVar17,
                 pcVar20 + ((anonymous_namespace)::preReadBuffer._0_8_ -
                           (anonymous_namespace)::readingBuffer),uVar10,uVar11,1,1,0.4,false,false);
      Imf_3_2::FrameBuffer::insert((char *)prereadbuf,pSVar5);
    }
    lVar9 = 2;
    if (PVar17 != HALF) {
      if (PVar17 != FLOAT) {
        std::operator<<((ostream *)&std::cout,"Unexpected Pixel Type\n");
        goto LAB_0017e3ef;
      }
      lVar9 = 4;
    }
    pcVar20 = pcVar20 + lVar9;
    uVar25 = uVar25 + 1;
  } while( true );
}

Assistant:

ChannelList
setupBuffer (
    const Header&      hdr,      // header to grab datawindow from
    const char* const* channels, // NULL terminated list of channels to write
    const char* const*
        passivechannels,  // NULL terminated list of channels to write
    const PixelType* pt,  // type of each channel, or NULL for all HALF
    FrameBuffer&     buf, // buffer to fill with pointers to channel
    FrameBuffer&
        prereadbuf, // channels which aren't being read - indexes into the preread buffer
    FrameBuffer&
         postreadbuf, // channels which aren't being read - indexes into the postread buffer
    int  banks, // number of banks - channels within each bank are interleaved, banks are scanline interleaved
    bool writing // true if should allocate
)
{
    Box2i dw = hdr.dataWindow ();

    //
    // how many channels in total
    //
    int  activechans     = 0;
    int  bytes_per_pixel = 0;
    bool has32BitValue   = false;
    while (channels[activechans] != NULL)
    {
        if (pt == NULL) { bytes_per_pixel += 2; }
        else
        {
            switch (pt[activechans])
            {
                case IMF::HALF: bytes_per_pixel += 2; break;
                case IMF::FLOAT:
                case IMF::UINT:
                    // some architectures (e.g arm7 cannot write 32 bit values
                    // to addresses which aren't aligned to 32 bit addresses)
                    // so bump to next multiple of four
                    bytes_per_pixel = alignToFour (bytes_per_pixel);
                    bytes_per_pixel += 4;
                    has32BitValue = true;
                    break;

                default: cout << "Unexpected PixelType?\n"; exit (1);
            }
        }
        activechans++;
    }

    int passivechans = 0;
    while (passivechannels != NULL && passivechannels[passivechans] != NULL)
    {
        if (pt == NULL) { bytes_per_pixel += 2; }
        else
        {
            switch (pt[passivechans + activechans])
            {
                case IMF::HALF: bytes_per_pixel += 2; break;
                case IMF::FLOAT:
                case IMF::UINT:
                    bytes_per_pixel = alignToFour (bytes_per_pixel);
                    bytes_per_pixel += 4;
                    has32BitValue = true;
                    break;
                default: cout << "Unexpected PixelType?\n"; exit (1);
            }
        }
        passivechans++;
    }

    if (has32BitValue) { bytes_per_pixel = alignToFour (bytes_per_pixel); }

    int chans = activechans + passivechans;

    int bytes_per_bank = bytes_per_pixel / banks;

    int samples = (hdr.dataWindow ().max.x + 1 - hdr.dataWindow ().min.x) *
                  (hdr.dataWindow ().max.y + 1 - hdr.dataWindow ().min.y) *
                  chans;

    int size = samples * bytes_per_pixel;

    if (writing) { writingBuffer.resize (size); }
    else
    {
        readingBuffer.resize (size);
    }

    const char* write_ptr = writing ? &writingBuffer[0] : &readingBuffer[0];
    // fill with random halfs, casting to floats for float channels
    int chan = 0;
    for (int i = 0; i < samples; i++)
    {
        unsigned short int values =
            random_int (std::numeric_limits<unsigned short>::max ());
        half v;
        v.setBits (values);
        if (pt == NULL || pt[chan] == IMF::HALF)
        {
            *(half*) write_ptr = half (v);
            write_ptr += 2;
        }
        else
        {
            write_ptr           = alignToFour (write_ptr);
            *(float*) write_ptr = float (v);

            write_ptr += 4;
        }
        chan++;
        if (chan == chans) { chan = 0; }
    }

    if (!writing)
    {
        //take a copy of the buffer as it was before being read
        preReadBuffer = readingBuffer;
    }

    char* offset = NULL;

    ChannelList chanlist;

    int bytes_per_row      = bytes_per_pixel * (dw.max.x + 1 - dw.min.x);
    int bytes_per_bank_row = bytes_per_row / banks;

    int first_pixel_index =
        bytes_per_row * dw.min.y + bytes_per_bank * dw.min.x;

    for (int i = 0; i < chans; i++)
    {
        PixelType type = pt == NULL ? IMF::HALF : pt[i];
        if (i < activechans && writing) { chanlist.insert (channels[i], type); }

        if (i % (chans / banks) == 0)
        {
            //
            // set offset pointer to beginning of bank
            //

            int bank = i / (chans / banks);
            offset   = (writing ? &writingBuffer[0] : &readingBuffer[0]) +
                     bank * bytes_per_bank_row - first_pixel_index;
        }

        if (type == FLOAT || type == UINT) { offset = alignToFour (offset); }

        if (i < activechans)
        {

            buf.insert (
                channels[i],
                Slice (
                    type,
                    offset,
                    bytes_per_bank,
                    bytes_per_row,
                    1,
                    1,
                    100 + i));
        }
        else
        {
            if (!writing)
            {

                postreadbuf.insert (
                    passivechannels[i - activechans],
                    Slice (
                        type,
                        offset,
                        bytes_per_bank,
                        bytes_per_row,
                        1,
                        1,
                        0.4));

                char* pre_offset =
                    offset - &readingBuffer[0] + &preReadBuffer[0];

                prereadbuf.insert (
                    passivechannels[i - activechans],
                    Slice (
                        type,
                        pre_offset,
                        bytes_per_bank,
                        bytes_per_row,
                        1,
                        1,
                        0.4));
            }
        }
        switch (type)
        {
            case IMF::HALF: offset += 2; break;
            case IMF::FLOAT: offset += 4; break;
            default: cout << "Unexpected Pixel Type\n"; exit (1);
        }
    }

    return chanlist;
}